

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_exec.cpp
# Opt level: O2

int FascodeUtil::custom_exec_v
              (char *fname,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  int iVar1;
  string fname_str;
  allocator<char> local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,fname,&local_69);
  std::__cxx11::string::string((string *)&local_50,local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,args);
  iVar1 = custom_exec_v(&local_50,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

int custom_exec_v(char* fname,std::vector<std::string> args){
        std::string fname_str=fname;
        return custom_exec_v(fname_str,args);
    }